

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,SMatrix<double,_3,_3> *a)

{
  undefined8 in_RAX;
  long lVar1;
  long lVar2;
  undefined8 uStack_38;
  char c;
  
  uStack_38 = in_RAX;
  std::operator>>(in,&c);
  if (c == '[') {
    lVar1 = 0;
    while ((lVar1 != 3 && (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0))) {
      lVar2 = 0;
      while ((lVar2 != 0x18 && (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0))) {
        std::istream::_M_extract<double>((double *)in);
        lVar2 = lVar2 + 8;
      }
      std::operator>>(in,&c);
      if ((lVar1 != 2) && (c != ';')) {
        std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
      }
      lVar1 = lVar1 + 1;
    }
    if (c == ']') {
      return in;
    }
  }
  std::ios::setstate((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  return in;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, SMatrix<T, nrows, ncols> &a)
{
  char c;

  in >> c;

  if (c == '[')
  {
    for (int k=0; k<nrows && in; k++)
    {
      for (int i=0; i<ncols && in; i++)
      {
        in >> a(k, i);
      }

      in >> c;

      if (k+1 < nrows && c != ';')
      {
        in.setstate(std::ios_base::failbit);
      }
    }

    if (c != ']')
    {
      in.setstate(std::ios_base::failbit);
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}